

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O2

void EthBasePort::PrintDebugDataRTI(ostream *debugStream,quadlet_t *data,double clockPeriod)

{
  bool bVar1;
  byte bVar2;
  ostream *poVar3;
  allocator<char> local_51;
  double local_50;
  double local_48;
  string local_40;
  
  local_50 = clockPeriod;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"PrintDebugDataRTI",&local_51);
  bVar1 = CheckDebugHeader(debugStream,&local_40,(char *)data,3);
  std::__cxx11::string::~string((string *)&local_40);
  if (bVar1) {
    std::operator<<(debugStream,"*** RTI: ");
    bVar2 = *(byte *)((long)data + 7);
    if ((char)bVar2 < '\0') {
      std::operator<<(debugStream,"sendBusy ");
      bVar2 = *(byte *)((long)data + 7);
    }
    if ((bVar2 & 0x40) != 0) {
      std::operator<<(debugStream,"sendRequest ");
      bVar2 = *(byte *)((long)data + 7);
    }
    if ((bVar2 & 8) != 0) {
      std::operator<<(debugStream,"responseRequired ");
      bVar2 = *(byte *)((long)data + 7);
    }
    if ((bVar2 & 4) != 0) {
      std::operator<<(debugStream,"recvNotReady ");
      bVar2 = *(byte *)((long)data + 7);
    }
    if ((bVar2 & 2) != 0) {
      std::operator<<(debugStream,"recvReady ");
      bVar2 = *(byte *)((long)data + 7);
    }
    if ((bVar2 & 1) != 0) {
      std::operator<<(debugStream,"PortReady ");
    }
    poVar3 = std::endl<char,std::char_traits<char>>(debugStream);
    poVar3 = std::operator<<(poVar3,"rxState: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(byte *)((long)data + 7) >> 4 & 3);
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(debugStream,"numPacketRecv: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ushort)*(byte *)((long)data + 6));
    poVar3 = std::operator<<(poVar3,", numBytesRecv: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ushort)data[1]);
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(debugStream,"numPacketSent: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ushort)(byte)data[2]);
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(debugStream,"txState: ");
    std::ostream::operator<<(poVar3,*(byte *)((long)data + 9) & 7);
    if ((*(byte *)((long)data + 9) & 0x10) != 0) {
      std::operator<<(debugStream,", txStateError ");
    }
    poVar3 = std::endl<char,std::char_traits<char>>(debugStream);
    poVar3 = std::operator<<(poVar3,"respBytes: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(ushort *)((long)data + 10));
    std::endl<char,std::char_traits<char>>(poVar3);
    local_48 = local_50 * 1000000.0;
    std::operator<<(debugStream,"timeReceive: ");
    poVar3 = std::ostream::_M_insert<double>((double)(ushort)data[3] * local_50);
    std::operator<<(poVar3," timeSend: ");
    poVar3 = std::ostream::_M_insert<double>((double)*(ushort *)((long)data + 0xe) * local_50);
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(debugStream,"bw_wait: ");
    *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(ushort *)((long)data + 0x12));
    std::operator<<(poVar3," (");
    poVar3 = std::ostream::_M_insert<double>((double)*(ushort *)((long)data + 0x12) * local_48);
    poVar3 = std::operator<<(poVar3," us)");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  return;
}

Assistant:

void EthBasePort::PrintDebugDataRTI(std::ostream &debugStream, const quadlet_t *data, double clockPeriod)
{
    // Following structure must match DebugData in EthRtInterface.v
    struct DebugData {
        char      header[4];        // Quad 0
        uint16_t  recv_nbytes;      // Quad 1
        uint8_t   numRecv;
        uint8_t   statusbits;
        uint8_t   numSent;          // Quad 2
        uint8_t   txStateBits;
        uint16_t  respBytes;
        uint16_t  timeReceive;      // Quad 3
        uint16_t  timeSend;
        uint16_t  quad4_low;        // Quad 4
        uint16_t  bw_wait;
        uint32_t  unused[3];        // Quad 5-7
    };
    if (sizeof(DebugData) != 8*sizeof(quadlet_t)) {
        debugStream << "PrintDebugDataRTI: structure packing problem" << std::endl;
        return;
    }
    const DebugData *p = reinterpret_cast<const DebugData *>(data);
    if (!CheckDebugHeader(debugStream, "PrintDebugDataRTI", p->header, 3))
        return;

    debugStream << "*** RTI: ";
    if (p->statusbits & 0x80) debugStream << "sendBusy ";
    if (p->statusbits & 0x40) debugStream << "sendRequest ";
    if (p->statusbits & 0x08) debugStream << "responseRequired ";
    if (p->statusbits & 0x04) debugStream << "recvNotReady ";
    if (p->statusbits & 0x02) debugStream << "recvReady ";
    if (p->statusbits & 0x01) debugStream << "PortReady ";
    debugStream << std::endl << "rxState: " << static_cast<uint16_t>((p->statusbits&0x30)>>4) << std::endl;
    debugStream << "numPacketRecv: " << static_cast<uint16_t>(p->numRecv)
                << ", numBytesRecv: " << p->recv_nbytes << std::endl;
    debugStream << "numPacketSent: " << static_cast<uint16_t>(p->numSent) << std::endl;
    debugStream << "txState: " << static_cast<uint16_t>(p->txStateBits&0x07);
    if (p->txStateBits&0x10) debugStream << ", txStateError ";
    debugStream << std::endl << "respBytes: " << p->respBytes << std::endl;
    const double bits2uS = clockPeriod*1e6;
    debugStream << "timeReceive: " << (p->timeReceive*clockPeriod) << " timeSend: " << (p->timeSend*clockPeriod) << std::endl;
    debugStream << "bw_wait: " << std::dec << p->bw_wait << " (" << p->bw_wait*bits2uS << " us)" << std::endl;
}